

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

int nk_selectable_image_text
              (nk_context *ctx,nk_image img,char *str,int len,nk_flags align,int *value)

{
  nk_vec2 nVar1;
  int iVar2;
  nk_window *pnVar3;
  nk_panel *pnVar4;
  nk_user_font *font;
  _func_void_nk_command_buffer_ptr_nk_handle *p_Var5;
  nk_widget_layout_states nVar6;
  int iVar7;
  nk_context *i;
  nk_command_buffer *out;
  float fVar8;
  float fVar9;
  float fVar10;
  nk_rect r;
  nk_rect bounds;
  nk_rect local_50;
  nk_rect local_40;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x51c9,
                  "int nk_selectable_image_text(struct nk_context *, struct nk_image, const char *, int, nk_flags, int *)"
                 );
  }
  if (value == (int *)0x0) {
    __assert_fail("value",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x51ca,
                  "int nk_selectable_image_text(struct nk_context *, struct nk_image, const char *, int, nk_flags, int *)"
                 );
  }
  pnVar3 = ctx->current;
  if (pnVar3 == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x51cb,
                  "int nk_selectable_image_text(struct nk_context *, struct nk_image, const char *, int, nk_flags, int *)"
                 );
  }
  pnVar4 = pnVar3->layout;
  if (pnVar4 != (nk_panel *)0x0) {
    nVar6 = nk_widget(&bounds,ctx);
    if (nVar6 != NK_WIDGET_INVALID) {
      i = (nk_context *)0x0;
      if ((nVar6 != NK_WIDGET_ROM) && ((pnVar4->flags & 0x1000) == 0)) {
        i = ctx;
      }
      font = (ctx->style).font;
      fVar10 = bounds.x;
      local_40.x = bounds.x;
      local_40.y = bounds.y;
      local_40.w = bounds.w;
      local_40.h = bounds.h;
      if (str == (char *)0x0) {
        __assert_fail("str",
                      "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                      ,0x396a,
                      "int nk_do_selectable_image(nk_flags *, struct nk_command_buffer *, struct nk_rect, const char *, int, nk_flags, int *, const struct nk_image *, const struct nk_style_selectable *, const struct nk_input *, const struct nk_user_font *)"
                     );
      }
      if (len == 0) {
        __assert_fail("len",
                      "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                      ,0x396b,
                      "int nk_do_selectable_image(nk_flags *, struct nk_command_buffer *, struct nk_rect, const char *, int, nk_flags, int *, const struct nk_image *, const struct nk_style_selectable *, const struct nk_input *, const struct nk_user_font *)"
                     );
      }
      if (font == (nk_user_font *)0x0) {
        __assert_fail("font",
                      "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                      ,0x396e,
                      "int nk_do_selectable_image(nk_flags *, struct nk_command_buffer *, struct nk_rect, const char *, int, nk_flags, int *, const struct nk_image *, const struct nk_style_selectable *, const struct nk_input *, const struct nk_user_font *)"
                     );
      }
      iVar2 = *value;
      nVar1 = (ctx->style).selectable.touch_padding;
      fVar8 = nVar1.x;
      r.x = fVar10 - fVar8;
      fVar9 = nVar1.y;
      r.y = bounds.y - fVar9;
      r.w = fVar8 + fVar8 + bounds.w;
      r.h = fVar9 + fVar9 + bounds.h;
      iVar7 = nk_button_behavior(&ctx->last_widget_state,r,&i->input,NK_BUTTON_DEFAULT);
      if (iVar7 != 0) {
        *value = (uint)(*value == 0);
      }
      fVar8 = (ctx->style).selectable.padding.y;
      local_50.h = bounds.h - (fVar8 + fVar8);
      if ((align & 1) == 0) {
        fVar9 = (ctx->style).selectable.padding.x;
        local_50.x = fVar9 + fVar9 + fVar10;
      }
      else {
        fVar9 = (ctx->style).selectable.padding.x;
        fVar10 = (fVar10 + bounds.w) - (fVar9 + fVar9 + local_50.h);
        local_50.x = 0.0;
        if (0.0 <= fVar10) {
          local_50.x = fVar10;
        }
      }
      out = &pnVar3->buffer;
      nVar1 = (ctx->style).selectable.image_padding;
      fVar10 = nVar1.x;
      local_50.x = local_50.x + fVar10;
      fVar9 = nVar1.y;
      local_50.y = bounds.y + fVar8 + fVar9;
      local_50.w = local_50.h - (fVar10 + fVar10);
      local_50.h = local_50.h - (fVar9 + fVar9);
      p_Var5 = (ctx->style).selectable.draw_begin;
      if (p_Var5 != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
        (*p_Var5)(out,(nk_handle)(ctx->style).selectable.userdata.ptr);
      }
      nk_draw_selectable(out,ctx->last_widget_state,&(ctx->style).selectable,*value,&local_40,
                         &local_50,&img,str,len,align,font);
      p_Var5 = (ctx->style).selectable.draw_end;
      if (p_Var5 != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
        (*p_Var5)(out,(nk_handle)(ctx->style).selectable.userdata.ptr);
      }
      nVar6 = (nk_widget_layout_states)(iVar2 != *value);
    }
    return nVar6;
  }
  __assert_fail("ctx->current->layout",
                "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                ,0x51cc,
                "int nk_selectable_image_text(struct nk_context *, struct nk_image, const char *, int, nk_flags, int *)"
               );
}

Assistant:

NK_API int
nk_selectable_image_text(struct nk_context *ctx, struct nk_image img,
    const char *str, int len, nk_flags align, int *value)
{
    struct nk_window *win;
    struct nk_panel *layout;
    const struct nk_input *in;
    const struct nk_style *style;

    enum nk_widget_layout_states state;
    struct nk_rect bounds;

    NK_ASSERT(ctx);
    NK_ASSERT(value);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout || !value)
        return 0;

    win = ctx->current;
    layout = win->layout;
    style = &ctx->style;

    state = nk_widget(&bounds, ctx);
    if (!state) return 0;
    in = (state == NK_WIDGET_ROM || layout->flags & NK_WINDOW_ROM) ? 0 : &ctx->input;
    return nk_do_selectable_image(&ctx->last_widget_state, &win->buffer, bounds,
                str, len, align, value, &img, &style->selectable, in, style->font);
}